

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

size_t __thiscall
spvtools::opt::analysis::TensorViewNV::ComputeExtraStateHash
          (TensorViewNV *this,size_t hash,SeenTypes *param_2)

{
  size_t sVar1;
  uint *puVar2;
  ulong uVar3;
  
  uVar3 = (hash >> 2) + hash * 0x40 + 0x9e3779b9 + (ulong)*(uint *)&(this->super_Type).field_0x24 ^
          hash;
  sVar1 = (uVar3 >> 2) + 0x9e3779b9 + uVar3 * 0x40 + (ulong)this->has_dimensions_id_ ^ uVar3;
  for (puVar2 = (this->perm_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar2 != (this->perm_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    sVar1 = sVar1 ^ sVar1 * 0x40 + 0x9e3779b9 + (sVar1 >> 2) + (ulong)*puVar2;
  }
  return sVar1;
}

Assistant:

size_t TensorViewNV::ComputeExtraStateHash(size_t hash, SeenTypes*) const {
  return hash_combine(hash, dim_id_, has_dimensions_id_, perm_);
}